

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O2

void __thiscall SSD1306::OledI2C::sendCommand(OledI2C *this,uint8_t command)

{
  int __v;
  ssize_t sVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  array<unsigned_char,_2UL> data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string what;
  
  data._M_elems[0] = '\0';
  data._M_elems[1] = command;
  sVar1 = write((this->fd_).fd_,&data,2);
  if (sVar1 != -1) {
    return;
  }
  std::__cxx11::to_string(&local_50,0x1dc);
  std::operator+(&local_70,
                 "write /workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/OledI2C.cxx("
                 ,&local_50);
  std::operator+(&what,&local_70,")");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  __v = *piVar2;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,__v,__ecat,&what);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void
SSD1306::OledI2C::sendCommand(
    uint8_t command) const
{
    std::array<uint8_t, 2> data{OLED_COMMAND, command};

    if (::write(fd_.fd(), data.data(), data.size()) == -1)
    {
        std::string what( "write " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }
}